

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O2

char * searchpath(lua_State *L,char *name,char *path,char *sep,char *dirsep)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  FILE *__stream;
  luaL_Buffer msg;
  
  luaL_buffinit(L,&msg);
  if (*sep != '\0') {
    name = luaL_gsub(L,name,sep,dirsep);
  }
  while( true ) {
    for (; *path == ';'; path = path + 1) {
    }
    if (*path == '\0') break;
    pcVar1 = strchr(path,0x3b);
    if (pcVar1 == (char *)0x0) {
      sVar2 = strlen(path);
      pcVar1 = path + sVar2;
    }
    lua_pushlstring(L,path,(long)pcVar1 - (long)path);
    if (pcVar1 == (char *)0x0) break;
    pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
    pcVar3 = luaL_gsub(L,pcVar3,"?",name);
    lua_remove(L,-2);
    __stream = fopen64(pcVar3,"r");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      return pcVar3;
    }
    lua_pushfstring(L,"\n\tno file \'%s\'",pcVar3);
    lua_remove(L,-2);
    luaL_addvalue(&msg);
    path = pcVar1;
  }
  luaL_pushresult(&msg);
  return (char *)0x0;
}

Assistant:

static const char *searchpath (lua_State *L, const char *name,
			       const char *path, const char *sep,
			       const char *dirsep)
{
  luaL_Buffer msg;  /* to build error message */
  luaL_buffinit(L, &msg);
  if (*sep != '\0')  /* non-empty separator? */
    name = luaL_gsub(L, name, sep, dirsep);  /* replace it by 'dirsep' */
  while ((path = pushnexttemplate(L, path)) != NULL) {
    const char *filename = luaL_gsub(L, lua_tostring(L, -1),
				     LUA_PATH_MARK, name);
    lua_remove(L, -2);  /* remove path template */
    goto check_readable; /* suppress "unused label" warning */
check_readable:
    if (readable(filename))  /* does file exist and is readable? */
      return filename;  /* return that file name */
    lua_pushfstring(L, "\n\tno file " LUA_QS, filename);
#if LJ_TARGET_OSX || LJ_TARGET_IOS
    /* if *.dylib is missing, try *.so */
    size_t len = strlen(filename);
    if (len > 6 && strcmp(filename + len - 6, ".dylib") == 0) {
      luaL_addvalue(&msg);  /* concatenate error msg. entry */
      lua_pushlstring(L, filename, len - 6);
      filename = lua_pushfstring(L, "%s.so", lua_tostring(L, -1));
      lua_insert(L, -3); /* sink new filename below old one */
      lua_pop(L, 2);
      goto check_readable;
    }
#endif
    lua_remove(L, -2);  /* remove file name */
    luaL_addvalue(&msg);  /* concatenate error msg. entry */
  }
  luaL_pushresult(&msg);  /* create error message */
  return NULL;  /* not found */
}